

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O0

void __thiscall GuidedMeshNormalFiltering::denoise(GuidedMeshNormalFiltering *this)

{
  size_t sVar1;
  undefined1 local_260 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  filtered_normals;
  undefined1 local_238 [8];
  TriMesh mesh;
  GuidedMeshNormalFiltering *this_local;
  
  mesh.super_Mesh.
  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>._544_8_
       = this;
  DataManager::getNoisyMesh((TriMesh *)local_238,(this->super_MeshDenoisingBase).data_manager_);
  sVar1 = OpenMesh::ArrayKernel::n_vertices((ArrayKernel *)local_238);
  if (sVar1 != 0) {
    std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
    vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *)
           local_260);
    (*(this->super_MeshDenoisingBase)._vptr_MeshDenoisingBase[2])
              (this,local_238,
               (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                *)local_260);
    DataManager::setMesh((this->super_MeshDenoisingBase).data_manager_,(TriMesh *)local_238);
    DataManager::setDenoisedMesh((this->super_MeshDenoisingBase).data_manager_,(TriMesh *)local_238)
    ;
    std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
    ~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *)
            local_260);
  }
  filtered_normals.
  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
  filtered_normals.
  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = sVar1 == 0;
  OpenMesh::TriMesh_ArrayKernelT<MyTraits>::~TriMesh_ArrayKernelT
            ((TriMesh_ArrayKernelT<MyTraits> *)local_238);
  return;
}

Assistant:

void GuidedMeshNormalFiltering::denoise()
{
    // get data
    TriMesh mesh = data_manager_->getNoisyMesh();

    if(mesh.n_vertices() == 0)
        return;

    // update face normal
    std::vector<TriMesh::Normal> filtered_normals;
    updateFilteredNormals(mesh, filtered_normals);

    // update data
    data_manager_->setMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}